

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

void __thiscall jrtplib::RTPSources::SentRTPPacket(RTPSources *this)

{
  bool bVar1;
  RTPInternalSourceData *this_00;
  
  this_00 = this->owndata;
  if (this_00 != (RTPInternalSourceData *)0x0) {
    bVar1 = (this_00->super_RTPSourceData).issender;
    RTPInternalSourceData::SentRTPPacket(this_00);
    if ((bVar1 == false) && ((this->owndata->super_RTPSourceData).issender == true)) {
      this->sendercount = this->sendercount + 1;
    }
  }
  return;
}

Assistant:

void RTPSources::SentRTPPacket()
{
	if (owndata == 0)
		return;

	bool prevsender = owndata->IsSender();
	
	owndata->SentRTPPacket();
	if (!prevsender && owndata->IsSender())
		sendercount++;
}